

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::anon_unknown_35::InMemoryDirectory::EntryImpl::EntryImpl(EntryImpl *this,EntryImpl *param_1)

{
  uint uVar1;
  undefined8 uVar2;
  
  (this->name).content.ptr = (param_1->name).content.ptr;
  (this->name).content.size_ = (param_1->name).content.size_;
  (this->name).content.disposer = (param_1->name).content.disposer;
  (param_1->name).content.ptr = (char *)0x0;
  (param_1->name).content.size_ = 0;
  uVar1 = (param_1->node).tag;
  (this->node).tag = uVar1;
  if (uVar1 != 3) {
    if ((uVar1 == 2) || (uVar1 == 1)) {
      uVar2 = *(undefined8 *)((long)&(param_1->node).field_1 + 8);
      (this->node).field_1.forceAligned = (param_1->node).field_1.forceAligned;
      *(undefined8 *)((long)&(this->node).field_1 + 8) = uVar2;
      *(undefined8 *)((long)&(param_1->node).field_1 + 8) = 0;
    }
    return;
  }
  ctor<kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode,kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
            ((SymlinkNode *)&(this->node).field_1,(SymlinkNode *)&(param_1->node).field_1);
  return;
}

Assistant:

inline Array(Array&& other) noexcept
      : ptr(other.ptr), size_(other.size_), disposer(other.disposer) {
    other.ptr = nullptr;
    other.size_ = 0;
  }